

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::MakeRoomForWrite(DBImpl *this,bool force)

{
  uint64_t uVar1;
  Env *pEVar2;
  DB DVar3;
  WritableFile *dest;
  pthread_mutex_t *this_00;
  int iVar4;
  size_t sVar5;
  Writer *pWVar6;
  MemTable *this_01;
  byte in_DL;
  byte bVar7;
  undefined7 in_register_00000031;
  DBImpl *this_02;
  char *format;
  Logger *info_log;
  DB local_80;
  uint64_t local_78;
  WritableFile *lfile;
  InternalKeyComparator *local_68;
  string *local_60;
  pthread_mutex_t *local_58;
  string local_50;
  
  this_02 = (DBImpl *)CONCAT71(in_register_00000031,force);
  local_58 = (pthread_mutex_t *)&this_02->mutex_;
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  bVar7 = in_DL ^ 1;
  local_60 = &this_02->dbname_;
  local_68 = &this_02->internal_comparator_;
  do {
    while( true ) {
      while( true ) {
        if ((this_02->bg_error_).state_ != (char *)0x0) {
          Status::operator=((Status *)this,&this_02->bg_error_);
          return (Status)(char *)this;
        }
        if (((bVar7 & 1) == 0) ||
           (iVar4 = VersionSet::NumLevelFiles(this_02->versions_,0), this_00 = local_58,
           iVar4 < 0x10)) break;
        pthread_mutex_unlock(local_58);
        (*this_02->env_->_vptr_Env[0x14])();
        std::mutex::lock((mutex *)&this_00->__data);
        bVar7 = 0;
      }
      if (((in_DL & 1) == 0) &&
         (sVar5 = MemTable::ApproximateMemoryUsage(this_02->mem_),
         sVar5 <= (this_02->options_).write_buffer_size)) {
        return (Status)(char *)this;
      }
      if (this_02->imm_ == (MemTable *)0x0) break;
      info_log = (this_02->options_).info_log;
      format = "Current memtable full; waiting...\n";
LAB_0010bf5a:
      Log(info_log,format);
      port::CondVar::Wait(&this_02->background_work_finished_signal_);
    }
    iVar4 = VersionSet::NumLevelFiles(this_02->versions_,0);
    if (0x3f < iVar4) {
      info_log = (this_02->options_).info_log;
      format = "Too many L0 files; waiting...\n";
      goto LAB_0010bf5a;
    }
    local_78 = this_02->versions_->next_file_number_;
    uVar1 = local_78 + 1;
    this_02->versions_->next_file_number_ = uVar1;
    lfile = (WritableFile *)0x0;
    pEVar2 = this_02->env_;
    LogFileName(&local_50,local_60,local_78);
    (*pEVar2->_vptr_Env[4])(&local_80,pEVar2,&local_50,&lfile);
    DVar3._vptr_DB = local_80._vptr_DB;
    (this->super_DB)._vptr_DB = local_80._vptr_DB;
    local_80._vptr_DB = (_func_int **)0x0;
    Status::~Status((Status *)&local_80);
    std::__cxx11::string::_M_dispose();
    if (DVar3._vptr_DB != (_func_int **)0x0) {
      if (this_02->versions_->next_file_number_ != uVar1) {
        return (Status)(char *)this;
      }
      this_02->versions_->next_file_number_ = local_78;
      return (Status)(char *)this;
    }
    pWVar6 = this_02->log_;
    if (pWVar6 != (Writer *)0x0) {
      log::Writer::~Writer(pWVar6);
    }
    operator_delete(pWVar6,0x20);
    if (this_02->logfile_ != (WritableFile *)0x0) {
      (*this_02->logfile_->_vptr_WritableFile[1])();
    }
    dest = lfile;
    this_02->logfile_ = lfile;
    this_02->logfile_number_ = local_78;
    pWVar6 = (Writer *)operator_new(0x20);
    log::Writer::Writer(pWVar6,dest);
    this_02->log_ = pWVar6;
    this_02->imm_ = this_02->mem_;
    (this_02->has_imm_)._M_base._M_i = true;
    this_01 = (MemTable *)operator_new(0x70);
    MemTable::MemTable(this_01,local_68);
    this_02->mem_ = this_01;
    this_01->refs_ = this_01->refs_ + 1;
    MaybeScheduleCompaction(this_02);
    in_DL = 0;
  } while( true );
}

Assistant:

Status DBImpl::MakeRoomForWrite(bool force) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  bool allow_delay = !force;
  Status s;
  while (true) {
    if (!bg_error_.ok()) {
      // Yield previous error
      s = bg_error_;
      break;
    } else if (allow_delay && versions_->NumLevelFiles(0) >=
                                  config::kL0_SlowdownWritesTrigger) {
      // We are getting close to hitting a hard limit on the number of
      // L0 files.  Rather than delaying a single write by several
      // seconds when we hit the hard limit, start delaying each
      // individual write by 1ms to reduce latency variance.  Also,
      // this delay hands over some CPU to the compaction thread in
      // case it is sharing the same core as the writer.
      mutex_.Unlock();
      env_->SleepForMicroseconds(1000);
      allow_delay = false;  // Do not delay a single write more than once
      mutex_.Lock();
    } else if (!force &&
               (mem_->ApproximateMemoryUsage() <= options_.write_buffer_size)) {
      // There is room in current memtable
      break;
    } else if (imm_ != nullptr) {
      // We have filled up the current memtable, but the previous
      // one is still being compacted, so we wait.
      Log(options_.info_log, "Current memtable full; waiting...\n");
      background_work_finished_signal_.Wait();
    } else if (versions_->NumLevelFiles(0) >= config::kL0_StopWritesTrigger) {
      // There are too many level-0 files.
      Log(options_.info_log, "Too many L0 files; waiting...\n");
      background_work_finished_signal_.Wait();
    } else {
      // Attempt to switch to a new memtable and trigger compaction of old
      assert(versions_->PrevLogNumber() == 0);
      uint64_t new_log_number = versions_->NewFileNumber();
      WritableFile* lfile = nullptr;
      s = env_->NewWritableFile(LogFileName(dbname_, new_log_number), &lfile);
      if (!s.ok()) {
        // Avoid chewing through file number space in a tight loop.
        versions_->ReuseFileNumber(new_log_number);
        break;
      }
      delete log_;
      delete logfile_;
      logfile_ = lfile;
      logfile_number_ = new_log_number;
      log_ = new log::Writer(lfile);
      imm_ = mem_;
      has_imm_.store(true, std::memory_order_release);
      mem_ = new MemTable(internal_comparator_);
      mem_->Ref();
      force = false;  // Do not force another compaction if have room
      MaybeScheduleCompaction();
    }
  }
  return s;
}